

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,unsigned_int,unsigned_int>
          (ResultBuilder *this,uint *lhs,uint *rhs)

{
  uint uVar1;
  uint uVar2;
  ContextOptions *pCVar3;
  uint *in_R8;
  String SStack_38;
  
  uVar2 = *lhs;
  uVar1 = *rhs;
  (this->super_AssertData).m_failed = uVar2 != uVar1;
  if ((uVar2 == uVar1) && (pCVar3 = getContextOptions(), pCVar3->success != true)) {
    return;
  }
  stringifyBinaryExpr<unsigned_int,unsigned_int>
            (&SStack_38,(detail *)lhs,(uint *)0x1a184a,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }